

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

void __thiscall
amrex::ForkJoin::modify_split
          (ForkJoin *this,string *name,int idx,
          Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
          *comp_split)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  Long LVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *this_00;
  ComponentSet *pCVar5;
  int in_EDX;
  long in_RDI;
  int i;
  char *in_stack_00000158;
  int in_stack_00000164;
  char *in_stack_00000168;
  char *in_stack_00000170;
  int in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *in_stack_ffffffffffffff40;
  int local_a4;
  
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
          ::count(in_stack_ffffffffffffff40,
                  (key_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (sVar3 != 0) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
    ::operator[](in_stack_ffffffffffffff40,
                 (key_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    LVar4 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::size
                      ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *)
                       0xf73b88);
    if (in_EDX < LVar4) goto LAB_00f73bf0;
  }
  Assert_host(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000158);
LAB_00f73bf0:
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    Assert_host(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000158);
  }
  this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
             *)Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
               ::size((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                       *)0xf73c63);
  iVar1 = NTasks((ForkJoin *)0xf73c72);
  if (this_00 !=
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
       *)(long)iVar1) {
    Assert_host(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000158);
  }
  local_a4 = 0;
  while (iVar1 = local_a4, iVar2 = NTasks((ForkJoin *)0xf73ce7), iVar1 < iVar2) {
    pCVar5 = Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
             operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                         *)this_00,CONCAT44(iVar1,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff38 = pCVar5->hi;
    pCVar5 = Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
             operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                         *)this_00,CONCAT44(iVar1,in_stack_ffffffffffffff38));
    if (in_stack_ffffffffffffff38 - pCVar5->lo < 1) {
      Assert_host(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000158);
    }
    local_a4 = local_a4 + 1;
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  ::operator[](this_00,(key_type *)CONCAT44(iVar1,in_stack_ffffffffffffff38));
  Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::operator[]
            ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *)this_00,
             CONCAT44(iVar1,in_stack_ffffffffffffff38));
  Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::operator=
            ((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
              *)this_00,
             (Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
              *)CONCAT44(iVar1,in_stack_ffffffffffffff38));
  return;
}

Assistant:

void
ForkJoin::modify_split (const std::string &name, int idx, Vector<ComponentSet> comp_split)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(data.count(name) > 0 && data[name].size() > idx,
                                     "(name, index) pair doesn't exist");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!flag_invoked,
                                     "Can only specify custom split before first forkjoin() invocation");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(comp_split.size() == NTasks(),
                                     "comp_split must be same length as number of tasks");
    for (int i = 0; i < NTasks(); ++i) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(comp_split[i].hi - comp_split[i].lo > 0,
                                         "comp_split[i] must have positive number of components");
    }
    data[name][idx].comp_split = std::move(comp_split);
}